

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void vdebug(char *msg,__va_list_tag *ap)

{
  char *buf_00;
  undefined1 local_38 [8];
  string buf;
  __va_list_tag *ap_local;
  char *msg_local;
  
  buf.field_2._8_8_ = ap;
  vdebugmsg_abi_cxx11_((string *)local_38,msg,ap);
  buf_00 = (char *)std::__cxx11::string::c_str();
  debugoutput(buf_00);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void vdebug(const char *msg, va_list ap)
{
    std::string buf= vdebugmsg(msg, ap);
#ifdef WIN32
    if (g_debugOutputFlags&DBG_WCHAROUTPUT) {
        wdebugoutput(ToWString(buf).c_str());
    }
#endif
    debugoutput(buf.c_str());
}